

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O2

int GetCurrentMonitor(void)

{
  int iVar1;
  GLFWmonitor **ppGVar2;
  GLFWmonitor *pGVar3;
  GLFWvidmode *pGVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int i;
  ulong uVar9;
  int my;
  int mx;
  int monitorCount;
  int wcy;
  int wcx;
  
  monitorCount = 0;
  ppGVar2 = glfwGetMonitors(&monitorCount);
  if (monitorCount < 1) {
    iVar7 = 0;
  }
  else if (CORE.Window.fullscreen == true) {
    pGVar3 = glfwGetWindowMonitor(platform.handle);
    iVar7 = 0;
    uVar9 = (ulong)(uint)monitorCount;
    if (monitorCount < 1) {
      uVar9 = 0;
    }
    for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      if (ppGVar2[uVar5] == pGVar3) {
        return (int)uVar5;
      }
    }
  }
  else {
    wcx = 0;
    wcy = 0;
    glfwGetWindowPos(platform.handle,&wcx,&wcy);
    wcx = wcx + (int)CORE.Window.screen.width / 2;
    wcy = wcy + (int)CORE.Window.screen.height / 2;
    iVar6 = 0x7fffffff;
    uVar5 = 0;
    for (uVar9 = 0; iVar7 = (int)uVar5, (long)uVar9 < (long)monitorCount; uVar9 = uVar9 + 1) {
      mx = 0;
      my = 0;
      pGVar3 = ppGVar2[uVar9];
      glfwGetMonitorPos(pGVar3,&mx,&my);
      pGVar4 = glfwGetVideoMode(pGVar3);
      if (pGVar4 == (GLFWvidmode *)0x0) {
        TraceLog(4,"GLFW: Failed to find video mode for selected monitor");
      }
      else {
        iVar7 = pGVar4->width + mx;
        iVar1 = pGVar4->height + my;
        if ((((mx <= wcx) && (wcx < iVar7)) && (my <= wcy)) && (wcy < iVar1)) {
          return (int)uVar9;
        }
        iVar8 = wcx;
        if (iVar7 <= wcx) {
          iVar8 = pGVar4->width + mx + -1;
        }
        if (wcx < mx) {
          iVar8 = mx;
        }
        iVar7 = wcy;
        if (iVar1 <= wcy) {
          iVar7 = pGVar4->height + my + -1;
        }
        if (wcy < my) {
          iVar7 = my;
        }
        iVar7 = (wcy - iVar7) * (wcy - iVar7) + (wcx - iVar8) * (wcx - iVar8);
        if (iVar7 < iVar6) {
          uVar5 = uVar9 & 0xffffffff;
          iVar6 = iVar7;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int GetCurrentMonitor(void)
{
    int index = 0;
    int monitorCount = 0;
    GLFWmonitor **monitors = glfwGetMonitors(&monitorCount);
    GLFWmonitor *monitor = NULL;

    if (monitorCount >= 1)
    {
        if (IsWindowFullscreen())
        {
            // Get the handle of the monitor that the specified window is in full screen on
            monitor = glfwGetWindowMonitor(platform.handle);

            for (int i = 0; i < monitorCount; i++)
            {
                if (monitors[i] == monitor)
                {
                    index = i;
                    break;
                }
            }
        }
        else
        {
            // In case the window is between two monitors, we use below logic
            // to try to detect the "current monitor" for that window, note that
            // this is probably an overengineered solution for a very side case
            // trying to match SDL behaviour

            int closestDist = 0x7FFFFFFF;

            // Window center position
            int wcx = 0;
            int wcy = 0;

            glfwGetWindowPos(platform.handle, &wcx, &wcy);
            wcx += (int)CORE.Window.screen.width/2;
            wcy += (int)CORE.Window.screen.height/2;

            for (int i = 0; i < monitorCount; i++)
            {
                // Monitor top-left position
                int mx = 0;
                int my = 0;

                monitor = monitors[i];
                glfwGetMonitorPos(monitor, &mx, &my);
                const GLFWvidmode *mode = glfwGetVideoMode(monitor);

                if (mode)
                {
                    const int right = mx + mode->width - 1;
                    const int bottom = my + mode->height - 1;

                    if ((wcx >= mx) &&
                        (wcx <= right) &&
                        (wcy >= my) &&
                        (wcy <= bottom))
                    {
                        index = i;
                        break;
                    }

                    int xclosest = wcx;
                    if (wcx < mx) xclosest = mx;
                    else if (wcx > right) xclosest = right;

                    int yclosest = wcy;
                    if (wcy < my) yclosest = my;
                    else if (wcy > bottom) yclosest = bottom;

                    int dx = wcx - xclosest;
                    int dy = wcy - yclosest;
                    int dist = (dx*dx) + (dy*dy);
                    if (dist < closestDist)
                    {
                        index = i;
                        closestDist = dist;
                    }
                }
                else TRACELOG(LOG_WARNING, "GLFW: Failed to find video mode for selected monitor");
            }
        }
    }

    return index;
}